

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

U64 ZSTD_ldm_fillLdmHashTable
              (ldmState_t *state,U64 lastHash,BYTE *lastHashed,BYTE *iend,BYTE *base,U32 hBits,
              ldmParams_t ldmParams)

{
  BYTE *local_48;
  BYTE *cur;
  U64 rollingHash;
  U32 hBits_local;
  BYTE *base_local;
  BYTE *iend_local;
  BYTE *lastHashed_local;
  U64 lastHash_local;
  ldmState_t *state_local;
  
  cur = (BYTE *)lastHash;
  for (local_48 = lastHashed + 1; local_48 < iend; local_48 = local_48 + 1) {
    cur = (BYTE *)ZSTD_rollingHash_rotate
                            ((U64)cur,local_48[-1],local_48[ldmParams.minMatchLength - 1],
                             state->hashPower);
    ZSTD_ldm_makeEntryAndInsertByTag(state,(U64)cur,hBits,(int)local_48 - (int)base,ldmParams);
  }
  return (U64)cur;
}

Assistant:

static U64 ZSTD_ldm_fillLdmHashTable(ldmState_t* state,
                                     U64 lastHash, const BYTE* lastHashed,
                                     const BYTE* iend, const BYTE* base,
                                     U32 hBits, ldmParams_t const ldmParams)
{
    U64 rollingHash = lastHash;
    const BYTE* cur = lastHashed + 1;

    while (cur < iend) {
        rollingHash = ZSTD_rollingHash_rotate(rollingHash, cur[-1],
                                              cur[ldmParams.minMatchLength-1],
                                              state->hashPower);
        ZSTD_ldm_makeEntryAndInsertByTag(state,
                                         rollingHash, hBits,
                                         (U32)(cur - base), ldmParams);
        ++cur;
    }
    return rollingHash;
}